

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDEntityDecl.cpp
# Opt level: O3

XProtoType * __thiscall xercesc_4_0::DTDEntityDecl::getProtoType(DTDEntityDecl *this)

{
  return (XProtoType *)classDTDEntityDecl;
}

Assistant:

void DTDEntityDecl::serialize(XSerializeEngine& serEng)
{
    XMLEntityDecl::serialize(serEng);

    if (serEng.isStoring())
    {
        serEng<<fDeclaredInIntSubset;
        serEng<<fIsParameter;
        serEng<<fIsSpecialChar;
    }
    else
    {
        serEng>>fDeclaredInIntSubset;
        serEng>>fIsParameter;
        serEng>>fIsSpecialChar;
    }
}